

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void __thiscall Omega_h::Read<long>::Read(Read<long> *this,initializer_list<long> l,string *name_in)

{
  void *__buf;
  HostWrite<long> local_48;
  Write<long> local_38;
  string *local_28;
  string *name_in_local;
  Read<signed_char> *this_local;
  initializer_list<long> l_local;
  
  l_local._M_array = (iterator)l._M_len;
  this_local = (Read<signed_char> *)l._M_array;
  local_28 = name_in;
  name_in_local = (string *)this;
  HostWrite<long>::HostWrite(&local_48,l,name_in);
  HostWrite<long>::write((HostWrite<long> *)&local_38,(int)&local_48,__buf,(size_t)name_in);
  Read(this,&local_38);
  Write<long>::~Write(&local_38);
  HostWrite<long>::~HostWrite(&local_48);
  return;
}

Assistant:

Read<T>::Read(std::initializer_list<T> l, std::string const& name_in)
    : Read<T>(HostWrite<T>(l, name_in).write()) {}